

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_2a1b1f::PKDescriptor::Clone(PKDescriptor *this)

{
  tuple<(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
  this_00;
  undefined8 uVar1;
  pointer *__ptr;
  long in_RSI;
  void *unaff_R14;
  pointer __p;
  long in_FS_OFFSET;
  PubkeyProvider *local_38;
  __uniq_ptr_impl<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
  local_30;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(undefined8 **)(in_RSI + 0x10) == *(undefined8 **)(in_RSI + 8)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      uVar1 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if (local_28._M_head_impl != (PubkeyProvider *)0x0) {
        (*(local_28._M_head_impl)->_vptr_PubkeyProvider[1])();
      }
      local_28._M_head_impl = (PubkeyProvider *)0x0;
      operator_delete(unaff_R14,0x60);
      if (local_38 != (PubkeyProvider *)0x0) {
        (*local_38->_vptr_PubkeyProvider[1])();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        _Unwind_Resume(uVar1);
      }
    }
  }
  else {
    (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x58))(&local_38);
    this_00.
    super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
    .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
          )operator_new(0x60);
    local_28._M_head_impl = local_38;
    local_38 = (PubkeyProvider *)0x0;
    PKDescriptor((PKDescriptor *)
                 this_00.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl,
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&local_28,*(bool *)(in_RSI + 0x58));
    if (local_28._M_head_impl != (PubkeyProvider *)0x0) {
      local_30._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
      .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
            )(tuple<(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
              )this_00.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl;
      (*(local_28._M_head_impl)->_vptr_PubkeyProvider[1])();
    }
    local_30._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
    .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
            )0x0;
    (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
         (_func_int **)
         this_00.
         super__Tuple_impl<0UL,_(anonymous_namespace)::PKDescriptor_*,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
         .super__Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false>._M_head_impl;
    std::
    unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                   *)&local_30);
    if (local_38 != (PubkeyProvider *)0x0) {
      (*local_38->_vptr_PubkeyProvider[1])();
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
                )this;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<PKDescriptor>(m_pubkey_args.at(0)->Clone(), m_xonly);
    }